

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTextLength>::copyAppend
          (QPodArrayOps<QTextLength> *this,qsizetype n,parameter_type t)

{
  long lVar1;
  qreal qVar2;
  undefined4 uVar3;
  QTextLength *pQVar4;
  bool bVar5;
  
  if (n != 0) {
    lVar1 = (this->super_QArrayDataPointer<QTextLength>).size;
    pQVar4 = (this->super_QArrayDataPointer<QTextLength>).ptr + lVar1;
    (this->super_QArrayDataPointer<QTextLength>).size = lVar1 + n;
    while (bVar5 = n != 0, n = n + -1, bVar5) {
      uVar3 = *(undefined4 *)&t->field_0x4;
      qVar2 = t->fixedValueOrPercentage;
      pQVar4->lengthType = t->lengthType;
      *(undefined4 *)&pQVar4->field_0x4 = uVar3;
      pQVar4->fixedValueOrPercentage = qVar2;
      pQVar4 = pQVar4 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t) noexcept
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *where = this->end();
        this->size += qsizetype(n);
        while (n--)
            *where++ = t;
    }